

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void i_number_suite::i_number_very_big_negative_int(void)

{
  undefined4 local_1bc;
  view_type local_1b8 [2];
  char input [50];
  reader reader;
  
  builtin_strncpy(input,"-237462374673276894279832749832423479823246327846",0x32);
  local_1b8[0]._M_len = strlen(input);
  local_1b8[0]._M_str = input;
  trial::protocol::json::basic_reader<char>::basic_reader(&reader,local_1b8);
  local_1b8[0]._M_len = CONCAT44(local_1b8[0]._M_len._4_4_,reader.decoder.current.code);
  local_1bc = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x77,"void i_number_suite::i_number_very_big_negative_int()",local_1b8,&local_1bc);
  local_1b8[0]._M_len =
       (long)reader.decoder.current.view.tail - (long)reader.decoder.current.view.head;
  local_1b8[0]._M_str = reader.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[50]>
            ("reader.literal()","\"-237462374673276894279832749832423479823246327846\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x78,"void i_number_suite::i_number_very_big_negative_int()",local_1b8,
             "-237462374673276894279832749832423479823246327846");
  trial::protocol::json::basic_reader<char>::overloader<long_long,_void>::value(&reader);
  boost::detail::throw_failed_impl
            ("reader.value<long long int>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x7c,"void i_number_suite::i_number_very_big_negative_int()");
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.stack);
  return;
}

Assistant:

void i_number_very_big_negative_int()
{
    const char input[] = "-237462374673276894279832749832423479823246327846";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "-237462374673276894279832749832423479823246327846");
    // Cannot be represented by integers
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<long long int>(),
                                    json::error,
                                    "invalid value");
}